

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

SSL_SESSION * SSL_process_tls13_new_session_ticket(SSL *ssl,uint8_t *buf,size_t buf_len)

{
  UniquePtr<SSL_SESSION> UVar1;
  uint16_t uVar2;
  int iVar3;
  pointer __p;
  int line;
  uint8_t type;
  UniquePtr<SSL_SESSION> session;
  CBS cbs;
  CBS body;
  
  iVar3 = SSL_in_init(ssl);
  if (((iVar3 == 0) && (uVar2 = bssl::ssl_protocol_version(ssl), uVar2 == 0x304)) &&
     ((ssl->field_0xa4 & 1) == 0)) {
    cbs.data = buf;
    cbs.len = buf_len;
    iVar3 = CBS_get_u8(&cbs,&type);
    if (((iVar3 != 0) && (iVar3 = CBS_get_u24_length_prefixed(&cbs,&body), iVar3 != 0)) &&
       (cbs.len == 0)) {
      bssl::tls13_create_session_with_ticket((SSL *)&session,(CBS *)ssl);
      UVar1 = session;
      if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
          session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
        session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session);
      return (SSL_SESSION *)
             (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
             UVar1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    }
    iVar3 = 0x89;
    line = 0xc43;
  }
  else {
    iVar3 = 0x42;
    line = 0xc39;
  }
  ERR_put_error(0x10,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,line);
  return (SSL_SESSION *)0x0;
}

Assistant:

SSL_SESSION *SSL_process_tls13_new_session_ticket(SSL *ssl, const uint8_t *buf,
                                                  size_t buf_len) {
  if (SSL_in_init(ssl) ||                             //
      ssl_protocol_version(ssl) != TLS1_3_VERSION ||  //
      ssl->server) {
    // Only TLS 1.3 clients are supported.
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return nullptr;
  }

  CBS cbs, body;
  CBS_init(&cbs, buf, buf_len);
  uint8_t type;
  if (!CBS_get_u8(&cbs, &type) ||                   //
      !CBS_get_u24_length_prefixed(&cbs, &body) ||  //
      CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return nullptr;
  }

  UniquePtr<SSL_SESSION> session = tls13_create_session_with_ticket(ssl, &body);
  if (!session) {
    // |tls13_create_session_with_ticket| puts the correct error.
    return nullptr;
  }
  return session.release();
}